

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O3

adt_error_t adt_ary_unshift(adt_ary_t *self,void *pElem)

{
  int iVar1;
  adt_error_t aVar2;
  uint uVar3;
  void **__dest;
  size_t __n;
  void **ppvVar4;
  
  if (self == (adt_ary_t *)0x0) {
    return '\x01';
  }
  iVar1 = self->s32CurLen;
  aVar2 = '\x04';
  if (iVar1 != 0x7fffffff) {
    ppvVar4 = self->pFirst;
    if (self->ppAlloc < ppvVar4) {
      self->pFirst = ppvVar4 + -1;
      ppvVar4[-1] = pElem;
      self->s32CurLen = iVar1 + 1;
    }
    else {
      aVar2 = adt_ary_extend(self,iVar1 + 1);
      if (aVar2 != '\0') {
        return aVar2;
      }
      ppvVar4 = self->pFirst;
      uVar3 = self->s32CurLen * 8 - 8;
      if (uVar3 != 0) {
        __dest = ppvVar4 + 1;
        do {
          __n = 0x10000;
          if (uVar3 < 0x10000) {
            __n = (size_t)uVar3;
          }
          memmove(__dest,ppvVar4,__n);
          __dest = (void **)((long)__dest + __n);
          ppvVar4 = (void **)((long)ppvVar4 + __n);
          uVar3 = uVar3 - (int)__n;
        } while (uVar3 != 0);
        ppvVar4 = self->pFirst;
      }
      *ppvVar4 = pElem;
    }
    aVar2 = '\0';
  }
  return aVar2;
}

Assistant:

adt_error_t	adt_ary_unshift(adt_ary_t *self, void *pElem){
   if ( self != 0 ) {
      if (self->s32CurLen == INT32_MAX) {
         return ADT_LENGTH_ERROR; //cannot fit any more elements into the array
      }
      if(self->pFirst > self->ppAlloc){
         //room for one more element at the beginning
         *(--self->pFirst)=pElem;
         self->s32CurLen++;
         return ADT_NO_ERROR;
      }
      else {
         //no room at beginning of array, move all array data forward by one
         uint8_t *pBegin,*pEnd;
         adt_error_t result;
         uint32_t u32ElemSize = sizeof(void**);
         result = adt_ary_extend(self,(int32_t) (self->s32CurLen+1));
         if (result == ADT_NO_ERROR) {
            uint32_t u32Remain;
            pBegin = (uint8_t*) self->pFirst+u32ElemSize;
            pEnd = ((uint8_t*) &self->pFirst[self->s32CurLen]);
            u32Remain = (uint32_t) (pEnd-pBegin);
            adt_block_memmove(pBegin, (uint8_t*) self->pFirst, u32Remain);
            self->pFirst[0]=pElem;
         }
         return result;
      }
   }
	return ADT_INVALID_ARGUMENT_ERROR;
}